

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O0

void TestBignumDtoaVariousDoubles(void)

{
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  Vector<char> representation_04;
  Vector<char> representation_05;
  Vector<char> representation_06;
  Vector<char> representation_07;
  Vector<char> representation_08;
  Vector<char> representation_09;
  Vector<char> representation_10;
  Vector<char> representation_11;
  Vector<char> representation_12;
  Vector<char> representation_13;
  Vector<char> representation_14;
  Vector<char> representation_15;
  Vector<char> representation_16;
  Vector<char> representation_17;
  uint64_t largest_denormal64;
  double v;
  uint64_t smallest_normal64;
  double max_double;
  double min_double;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  int *in_stack_000004c0;
  int *in_stack_000004c8;
  int in_stack_000004d0;
  BignumDtoaMode in_stack_000004d4;
  double in_stack_000004d8;
  Vector<char> in_stack_000004e0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 uVar1;
  int in_stack_fffffffffffffbfc;
  undefined1 condition;
  int iVar2;
  char *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  char *pcVar3;
  char *in_stack_fffffffffffffc10;
  char *expected_source;
  undefined8 in_stack_fffffffffffffc18;
  int line;
  char *in_stack_fffffffffffffc20;
  char *file;
  Double local_338;
  undefined8 local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  Double local_2f8;
  double local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined8 local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined8 local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 local_78 [16];
  char local_68 [104];
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  local_90 = (char *)local_78._0_8_;
  local_88 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_a0 = (char *)local_78._0_8_;
  local_98 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_b0 = (char *)local_78._0_8_;
  local_a8 = (char *)local_78._8_8_;
  representation.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_c0 = (char *)local_78._0_8_;
  local_b8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_d0 = (char *)local_78._0_8_;
  local_c8 = (char *)local_78._8_8_;
  representation_00.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_00.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_00._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_00);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_e0 = (char *)local_78._0_8_;
  local_d8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_f0 = (char *)local_78._0_8_;
  local_e8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_100 = (char *)local_78._0_8_;
  local_f8 = (char *)local_78._8_8_;
  representation_01.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_01.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_01._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_01);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_110 = (char *)local_78._0_8_;
  local_108 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_120 = (char *)local_78._0_8_;
  local_118 = (char *)local_78._8_8_;
  representation_02.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_02.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_02._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_02);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_128 = 1;
  local_138 = (char *)local_78._0_8_;
  local_130 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_148 = (char *)local_78._0_8_;
  local_140 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_158 = (char *)local_78._0_8_;
  local_150 = (char *)local_78._8_8_;
  representation_03.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_03.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_03._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_03);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  local_168 = (char *)local_78._0_8_;
  local_160 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_178 = (char *)local_78._0_8_;
  local_170 = (char *)local_78._8_8_;
  representation_04.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_04.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_04._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_04);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_180 = 0x7fefffffffffffff;
  local_190 = (char *)local_78._0_8_;
  local_188 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_1a0 = (char *)local_78._0_8_;
  local_198 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_1b0 = (char *)local_78._0_8_;
  local_1a8 = (char *)local_78._8_8_;
  representation_05.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_05.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_05._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_05);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_1c0 = (char *)local_78._0_8_;
  local_1b8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_1d0 = (char *)local_78._0_8_;
  local_1c8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_1e0 = (char *)local_78._0_8_;
  local_1d8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_1f0 = (char *)local_78._0_8_;
  local_1e8 = (char *)local_78._8_8_;
  representation_06.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_06.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_06._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_06);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_200 = (char *)local_78._0_8_;
  local_1f8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_210 = (char *)local_78._0_8_;
  local_208 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_220 = (char *)local_78._0_8_;
  local_218 = (char *)local_78._8_8_;
  representation_07.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_07.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_07._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_07);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_230 = (char *)local_78._0_8_;
  local_228 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_240 = (char *)local_78._0_8_;
  local_238 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_250 = (char *)local_78._0_8_;
  local_248 = (char *)local_78._8_8_;
  representation_08.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_08.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_08._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_08);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_260 = (char *)local_78._0_8_;
  local_258 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_270 = (char *)local_78._0_8_;
  local_268 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_280 = (char *)local_78._0_8_;
  local_278 = (char *)local_78._8_8_;
  representation_09.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_09.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_09._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_09);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_290 = (char *)local_78._0_8_;
  local_288 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_2a0 = (char *)local_78._0_8_;
  local_298 = (char *)local_78._8_8_;
  representation_10.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_10.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_10._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_10);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2b0 = (char *)local_78._0_8_;
  local_2a8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2c0 = (char *)local_78._0_8_;
  local_2b8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_2d0 = (char *)local_78._0_8_;
  local_2c8 = (char *)local_78._8_8_;
  representation_11.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_11.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_11._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_11);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2e0 = (char *)local_78._0_8_;
  local_2d8 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2e8 = 0x10000000000000;
  double_conversion::Double::Double(&local_2f8,0x10000000000000);
  local_2f0 = double_conversion::Double::value((Double *)0x82aa3f);
  local_308 = (char *)local_78._0_8_;
  local_300 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_318 = (char *)local_78._0_8_;
  local_310 = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  local_328 = (char *)local_78._0_8_;
  local_320 = (char *)local_78._8_8_;
  representation_12.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_12.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_12._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_12);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_330 = 0xfffffffffffff;
  double_conversion::Double::Double(&local_338,0xfffffffffffff);
  local_2f0 = double_conversion::Double::value((Double *)0x82ac49);
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  representation_13.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_13.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_13._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_13);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2f0 = 3.9292015898194143e-10;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  local_2f0 = 4194304.0;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  representation_14.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_14.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_14._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_14);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  local_2f0 = 3.316133905216739e-237;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  representation_15.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_15.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_15._8_8_ = in_stack_fffffffffffffc00;
  TrimRepresentation(representation_15);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(in_stack_fffffffffffffc20,iVar2,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  local_2f0 = 7.98851839160081e+191;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
              in_stack_fffffffffffffc00,SUB41((uint)in_stack_fffffffffffffbfc >> 0x18,0));
  representation_16.start_._4_4_ = in_stack_fffffffffffffbfc;
  representation_16.start_._0_4_ = in_stack_fffffffffffffbf8;
  representation_16._8_8_ = in_stack_fffffffffffffc00;
  pcVar3 = (char *)local_78._0_8_;
  file = (char *)local_78._8_8_;
  TrimRepresentation(representation_16);
  line = (int)((ulong)pcVar3 >> 0x20);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(file,line,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                    in_stack_fffffffffffffc00,
                    (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  CheckEqualsHelper(file,line,in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    in_stack_fffffffffffffbfc);
  condition = (undefined1)((uint)in_stack_fffffffffffffbfc >> 0x18);
  local_2f0 = 1.0000000000000013e+17;
  pcVar3 = (char *)local_78._0_8_;
  expected_source = (char *)local_78._8_8_;
  double_conversion::BignumDtoa
            (in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,in_stack_000004e0,
             in_stack_000004c8,in_stack_000004c0);
  CheckHelper(expected_source,(int)((ulong)pcVar3 >> 0x20),in_stack_fffffffffffffc00,(bool)condition
             );
  uVar1 = (undefined4)local_78._0_8_;
  iVar2 = SUB84(local_78._0_8_,4);
  representation_17._8_8_ = local_78._8_8_;
  representation_17.start_ = (char *)local_78._0_8_;
  TrimRepresentation(representation_17);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(file,line,expected_source,pcVar3,(char *)local_78._8_8_,
                    (char *)CONCAT44(iVar2,uVar1));
  CheckEqualsHelper(file,line,expected_source,(int)((ulong)pcVar3 >> 0x20),(char *)local_78._8_8_,
                    iVar2);
  return;
}

Assistant:

TEST(BignumDtoaVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  BignumDtoa(1.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_FIXED, 3, buffer, &length, &point);
  CHECK_GE(3, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK_GE(3, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_FIXED, 10, buffer, &length, &point);
  CHECK_GE(10, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_PRECISION, 10, buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  double min_double = 5e-324;
  BignumDtoa(min_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  BignumDtoa(min_double, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("", buffer.start());

  BignumDtoa(min_double, BIGNUM_DTOA_PRECISION, 5, buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  BignumDtoa(max_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(max_double, BIGNUM_DTOA_PRECISION, 7, buffer, &length, &point);
  CHECK_GE(7, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_EQ("429496727200000", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(4294967272.0, BIGNUM_DTOA_PRECISION, 14, buffer, &length, &point);
  CHECK_GE(14, length);
  TrimRepresentation(buffer);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_PRECISION, 20,
             buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("41855804968213567225", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_PRECISION, 1,
             buffer, &length, &point);
  CHECK_GE(1, length);
  TrimRepresentation(buffer);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(2147483648.0, BIGNUM_DTOA_FIXED, 2,
             buffer, &length, &point);
  CHECK_GE(2, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_PRECISION, 5,
             buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("35844466002796428", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_PRECISION, 10,
             buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(1e-23, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-22, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072013831", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("2225073858507201", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("2225073858507200889", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(4128420500802942e-24, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4128420500802942", buffer.start());
  CHECK_EQ(-8, point);

  v = 3.9292015898194142585311918e-10;
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("39292015898194143", buffer.start());

  v = 4194304.0;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("4194304", buffer.start());

  v = 3.3161339052167390562200598e-237;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 19, buffer, &length, &point);
  CHECK_GE(19, length);
  TrimRepresentation(buffer);
  CHECK_EQ("3316133905216739056", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK_GE(4, length);
  TrimRepresentation(buffer);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);

  v = 1.0000000000000012800000000e+17;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 1, buffer, &length, &point);
  CHECK_GE(1, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("100000000000000128", buffer.start());
  CHECK_EQ(18, point);
}